

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vmbignum.h
# Opt level: O1

int CVmObjBigNum::compute_eq_exact(char *ext1,char *ext2)

{
  ushort uVar1;
  ushort uVar2;
  ulong uVar3;
  uint uVar4;
  int iVar5;
  uint uVar6;
  char *pcVar7;
  ulong uVar8;
  ulong uVar9;
  
  if (((ext1[4] & 6U) == 0) && ((ext2[4] & 6U) == 0)) {
    uVar1 = *(ushort *)ext1;
    uVar2 = *(ushort *)ext2;
    uVar6 = (uint)uVar1;
    if (uVar1 < uVar2) {
      uVar6 = (uint)uVar2;
    }
    uVar4 = (uint)uVar2;
    pcVar7 = (char *)0x0;
    if (uVar1 < uVar2) {
      uVar4 = (uint)uVar1;
      pcVar7 = ext2;
    }
    if (uVar2 < uVar1) {
      pcVar7 = ext1;
    }
    if ((((ext2[4] ^ ext1[4]) & 1U) == 0) && (*(short *)(ext1 + 2) == *(short *)(ext2 + 2))) {
      uVar8 = 0;
      uVar9 = uVar8;
      if (uVar4 != 0) {
        uVar3 = 0;
        do {
          if (((byte)(ext2[(uVar3 >> 1) + 5] ^ ext1[(uVar3 >> 1) + 5]) >> (~(byte)uVar8 & 4) & 0xf)
              != 0) {
            return 0;
          }
          uVar3 = uVar3 + 1;
          uVar8 = (ulong)((int)uVar8 + 4);
          uVar9 = (ulong)uVar4;
        } while (uVar4 != uVar3);
      }
      if (pcVar7 != (char *)0x0) {
        if (uVar6 <= (uint)uVar9) {
          return 1;
        }
        iVar5 = uVar4 << 2;
        do {
          if (((byte)pcVar7[(uVar9 >> 1) + 5] >> (~(byte)iVar5 & 4) & 0xf) != 0) {
            return 0;
          }
          uVar9 = uVar9 + 1;
          iVar5 = iVar5 + 4;
        } while (uVar6 != uVar9);
        return 1;
      }
      return 1;
    }
  }
  return 0;
}

Assistant:

static int get_type(const char *ext)
        { return ext[VMBN_FLAGS] & VMBN_F_TYPE_MASK; }